

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O0

void __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVectorForClusteredBG>::BGIP_SolverMaxPlus
          (BGIP_SolverMaxPlus<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg,size_t maxiter,
          string *updateType,size_t verbosity,double damping,size_t nrSolutions,size_t nrRestarts)

{
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  ulong in_R8;
  undefined8 in_R9;
  MaxPlusSolverForBGs *in_XMM0_Qa;
  undefined8 in_stack_00000008;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *in_stack_ffffffffffffff88;
  undefined8 *puVar1;
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>
  *in_stack_ffffffffffffff90;
  string local_58 [32];
  undefined8 local_38;
  MaxPlusSolverForBGs *local_30;
  ulong local_28;
  undefined8 local_18;
  
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_18 = in_RDX;
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>::
  BayesianGameIdenticalPayoffSolver_T
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)in_RCX);
  puVar1 = in_RDI + 0x21;
  std::__cxx11::string::string(local_58,in_RCX);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            (local_30,puVar1,local_18,local_58,local_28 & 0xffffffff,local_38,in_stack_00000008);
  std::__cxx11::string::~string(local_58);
  *in_RDI = &PTR_InitDeadline_00179678;
  return;
}

Assistant:

BGIP_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg,
            size_t maxiter = 1000,
            std::string updateType=std::string("PARALL"),
            size_t verbosity = 2,
            double damping = 0.0,
            size_t nrSolutions = 1,
            size_t nrRestarts = 1
        ) :
        BayesianGameIdenticalPayoffSolver_T<JP>(bg),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
        {}